

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::negExpr(Parser *this)

{
  long lVar1;
  Report *this_00;
  undefined8 uVar2;
  size_type sVar3;
  Opcode OVar4;
  LiteralType args;
  pointer __dest;
  undefined8 *puVar5;
  long in_RSI;
  size_type __dnew;
  SourceLocation loc;
  string local_98;
  Expr *local_78;
  size_type local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58 [2];
  _Head_base<0UL,_flow::lang::Lexer_*,_false> local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  local_68 = (_Base_ptr)local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,*(long *)(lVar1 + 0x68),
             *(long *)(lVar1 + 0x70) + *(long *)(lVar1 + 0x68));
  uStack_38 = (undefined4)*(undefined8 *)(lVar1 + 0x98);
  uStack_34 = (undefined4)((ulong)*(undefined8 *)(lVar1 + 0x98) >> 0x20);
  local_48._M_head_impl =
       ((_Head_base<0UL,_flow::lang::Lexer_*,_false> *)(lVar1 + 0x88))->_M_head_impl;
  uStack_40 = (undefined4)*(undefined8 *)(lVar1 + 0x90);
  uStack_3c = (undefined4)((ulong)*(undefined8 *)(lVar1 + 0x90) >> 0x20);
  if ((*(Lexer **)(in_RSI + 0x30))->token_ == Minus) {
    Lexer::nextToken(*(Lexer **)(in_RSI + 0x30));
    negExpr((Parser *)&local_78);
    if (local_78 == (Expr *)0x0) {
      *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    }
    else {
      OVar4 = makeOperator(Minus,local_78);
      if (OVar4 == EXIT) {
        lVar1 = *(long *)(in_RSI + 0x30);
        this_00 = *(Report **)(in_RSI + 0x68);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        local_70 = 0x42;
        __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_70);
        sVar3 = local_70;
        local_98.field_2._M_allocated_capacity = local_70;
        local_98._M_dataplus._M_p = __dest;
        memcpy(__dest,"Type cast error in unary \'neg\'-operator. Invalid source type <{}>.",0x42);
        local_98._M_string_length = sVar3;
        __dest[sVar3] = '\0';
        args = (*(local_78->super_ASTNode)._vptr_ASTNode[3])(local_78);
        diagnostics::Report::typeError<flow::LiteralType>
                  (this_00,(SourceLocation *)(lVar1 + 0x30),&local_98,args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
        (*(local_78->super_ASTNode)._vptr_ASTNode[1])(local_78);
      }
      else {
        uStack_34 = *(undefined4 *)(*(long *)(in_RSI + 0x30) + 100);
        uVar2 = *(undefined8 *)(*(long *)(in_RSI + 0x30) + 0x5c);
        uStack_3c = (undefined4)uVar2;
        uStack_38 = (undefined4)((ulong)uVar2 >> 0x20);
        puVar5 = (undefined8 *)operator_new(0x50);
        *puVar5 = &PTR__ASTNode_001937f0;
        puVar5[1] = puVar5 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar5 + 1),local_68,(long)&local_60->_M_color + (long)local_68);
        puVar5[7] = CONCAT44(uStack_34,uStack_38);
        ((_Tuple_impl<0UL,_flow::lang::Lexer_*,_std::default_delete<flow::lang::Lexer>_> *)
        (puVar5 + 5))->super__Head_base<0UL,_flow::lang::Lexer_*,_false> =
             (_Head_base<0UL,_flow::lang::Lexer_*,_false>)local_48._M_head_impl;
        puVar5[6] = CONCAT44(uStack_3c,uStack_40);
        *puVar5 = &PTR__UnaryExpr_00193b88;
        *(Opcode *)(puVar5 + 8) = OVar4;
        puVar5[9] = local_78;
        *(undefined8 **)&(this->features_)._M_t._M_impl = puVar5;
      }
    }
  }
  else {
    bitNotExpr(this);
  }
  if (local_68 != (_Base_ptr)local_58) {
    operator_delete(local_68,(ulong)((long)&local_58[0]->_M_color + 1));
  }
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::negExpr() {
  // negExpr ::= ['-'] primaryExpr
  SourceLocation loc = location();

  if (consumeIf(Token::Minus)) {
    std::unique_ptr<Expr> e = negExpr();
    if (!e) return nullptr;

    Opcode op = makeOperator(Token::Minus, e.get());
    if (op == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error in unary 'neg'-operator. Invalid source type <{}>.",
          e->getType());
      return nullptr;
    }

    e = std::make_unique<UnaryExpr>(op, std::move(e), loc.update(end()));
    return e;
  } else {
    return bitNotExpr();
  }
}